

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O3

char * Cmd_DeriveConvertIntoString(int argc,char **argv)

{
  size_t sVar1;
  char *__dest;
  ulong uVar2;
  char pBuffer [1000];
  char acStack_418 [1008];
  
  memset(acStack_418,0,1000);
  if (0 < argc) {
    uVar2 = 0;
    do {
      strcat(acStack_418,argv[uVar2]);
      sVar1 = strlen(acStack_418);
      (acStack_418 + sVar1)[0] = ' ';
      (acStack_418 + sVar1)[1] = '\0';
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  sVar1 = strlen(acStack_418);
  __dest = (char *)malloc(sVar1 + 1);
  strcpy(__dest,acStack_418);
  return __dest;
}

Assistant:

char * Cmd_DeriveConvertIntoString( int argc, char ** argv )
{
    char pBuffer[CMD_AUTO_LINE_MAX] = {0};
    int i;
    for ( i = 0; i < argc; i++ )
    {
        strcat( pBuffer, argv[i] );
        strcat( pBuffer, " " );
    }
    return Abc_UtilStrsav(pBuffer);
}